

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

NFRule * __thiscall icu_63::NFRuleSet::findDoubleRule(NFRuleSet *this,double number)

{
  UBool UVar1;
  int64_t number_00;
  double dVar2;
  int64_t r;
  NFRule *rule_1;
  NFRule *rule;
  double number_local;
  NFRuleSet *this_local;
  
  UVar1 = isFractionRuleSet(this);
  if (UVar1 == '\0') {
    UVar1 = uprv_isNaN_63(number);
    if (UVar1 == '\0') {
      rule = (NFRule *)number;
      if (number < 0.0) {
        if (this->nonNumericalRules[0] != (NFRule *)0x0) {
          return this->nonNumericalRules[0];
        }
        rule = (NFRule *)((ulong)number ^ 0x8000000000000000);
      }
      UVar1 = uprv_isInfinite_63((double)rule);
      if (UVar1 == '\0') {
        dVar2 = uprv_floor_63((double)rule);
        if (((double)rule != dVar2) || (NAN((double)rule) || NAN(dVar2))) {
          if (((double)rule < 1.0) && (this->nonNumericalRules[2] != (NFRule *)0x0)) {
            return this->nonNumericalRules[2];
          }
          if (this->nonNumericalRules[1] != (NFRule *)0x0) {
            return this->nonNumericalRules[1];
          }
        }
        if (this->nonNumericalRules[3] == (NFRule *)0x0) {
          number_00 = util64_fromDouble((double)rule + 0.5);
          this_local = (NFRuleSet *)findNormalRule(this,number_00);
        }
        else {
          this_local = (NFRuleSet *)this->nonNumericalRules[3];
        }
      }
      else {
        r = (int64_t)this->nonNumericalRules[4];
        if ((NFRule *)r == (NFRule *)0x0) {
          r = (int64_t)RuleBasedNumberFormat::getDefaultInfinityRule(this->owner);
        }
        this_local = (NFRuleSet *)r;
      }
    }
    else {
      rule_1 = this->nonNumericalRules[5];
      if (rule_1 == (NFRule *)0x0) {
        rule_1 = RuleBasedNumberFormat::getDefaultNaNRule(this->owner);
      }
      this_local = (NFRuleSet *)rule_1;
    }
  }
  else {
    this_local = (NFRuleSet *)findFractionRuleSetRule(this,number);
  }
  return (NFRule *)this_local;
}

Assistant:

const NFRule*
NFRuleSet::findDoubleRule(double number) const
{
    // if this is a fraction rule set, use findFractionRuleSetRule()
    if (isFractionRuleSet()) {
        return findFractionRuleSetRule(number);
    }

    if (uprv_isNaN(number)) {
        const NFRule *rule = nonNumericalRules[NAN_RULE_INDEX];
        if (!rule) {
            rule = owner->getDefaultNaNRule();
        }
        return rule;
    }

    // if the number is negative, return the negative number rule
    // (if there isn't a negative-number rule, we pretend it's a
    // positive number)
    if (number < 0) {
        if (nonNumericalRules[NEGATIVE_RULE_INDEX]) {
            return  nonNumericalRules[NEGATIVE_RULE_INDEX];
        } else {
            number = -number;
        }
    }

    if (uprv_isInfinite(number)) {
        const NFRule *rule = nonNumericalRules[INFINITY_RULE_INDEX];
        if (!rule) {
            rule = owner->getDefaultInfinityRule();
        }
        return rule;
    }

    // if the number isn't an integer, we use one of the fraction rules...
    if (number != uprv_floor(number)) {
        // if the number is between 0 and 1, return the proper
        // fraction rule
        if (number < 1 && nonNumericalRules[PROPER_FRACTION_RULE_INDEX]) {
            return nonNumericalRules[PROPER_FRACTION_RULE_INDEX];
        }
        // otherwise, return the improper fraction rule
        else if (nonNumericalRules[IMPROPER_FRACTION_RULE_INDEX]) {
            return nonNumericalRules[IMPROPER_FRACTION_RULE_INDEX];
        }
    }

    // if there's a master rule, use it to format the number
    if (nonNumericalRules[MASTER_RULE_INDEX]) {
        return nonNumericalRules[MASTER_RULE_INDEX];
    }

    // and if we haven't yet returned a rule, use findNormalRule()
    // to find the applicable rule
    int64_t r = util64_fromDouble(number + 0.5);
    return findNormalRule(r);
}